

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::PrintTestPartResultToString_abi_cxx11_(TestPartResult *test_part_result)

{
  Type type;
  Message *this;
  TestPartResult *in_RSI;
  string *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  TestPartResult *in_stack_ffffffffffffff50;
  Message *in_stack_ffffffffffffff80;
  string local_38 [32];
  Message local_18;
  TestPartResult *local_10;
  
  local_10 = in_RSI;
  Message::Message(in_stack_ffffffffffffff80);
  TestPartResult::file_name(in_stack_ffffffffffffff50);
  TestPartResult::line_number(local_10);
  FormatFileLocation_abi_cxx11_(in_stack_00000008,unaff_retaddr);
  Message::operator<<((Message *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Message::operator<<((Message *)in_stack_ffffffffffffff50,(char (*) [2])in_stack_ffffffffffffff48);
  type = TestPartResult::type(local_10);
  TestPartResultTypeToString(type);
  Message::operator<<((Message *)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
  this = (Message *)TestPartResult::message((TestPartResult *)0x1ad894);
  Message::operator<<((Message *)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
  Message::GetString_abi_cxx11_(this);
  std::__cxx11::string::~string(local_38);
  Message::~Message(&local_18);
  return in_RDI;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}